

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

Variable *
rsg::anon_unknown_0::allocateNewVariable(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  VariableManager *this;
  ConstValueRangeAccess valueRange_00;
  int iVar1;
  Storage storage;
  Variable *variable;
  Scalar *unaff_RBX;
  float fVar2;
  float weights [4];
  float local_38;
  float local_34;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  
  variable = VariableManager::allocate(state->m_varManager,valueRange.m_type);
  VariableManager::setValue(state->m_varManager,variable,valueRange);
  valueRange_00.m_type._4_4_ = in_stack_ffffffffffffffd4;
  valueRange_00.m_type._0_4_ = in_stack_ffffffffffffffd0;
  valueRange_00.m_min = (Scalar *)in_stack_ffffffffffffffd8;
  valueRange_00.m_max = unaff_RBX;
  fVar2 = computeDynamicRangeWeight(valueRange_00);
  iVar1 = VariableType::getScalarSize(valueRange.m_type);
  this = state->m_varManager;
  local_38 = 1.0 - fVar2;
  if (local_38 <= 0.1) {
    local_38 = 0.1;
  }
  local_34 = 0.0;
  if (this->m_numAllocatedUniformScalars + iVar1 <= state->m_shaderParams->maxUniformScalars) {
    local_34 = fVar2 * 0.5;
  }
  storage = de::Random::chooseWeighted<rsg::Variable::Storage,rsg::Variable::Storage_const*,float*>
                      (state->m_random,allocateNewVariable::storages,(Storage *)&DAT_01cc5f40,
                       &local_38);
  VariableManager::setStorage(this,variable,storage);
  return variable;
}

Assistant:

Variable* allocateNewVariable (GeneratorState& state, ConstValueRangeAccess valueRange)
{
	Variable* variable = state.getVariableManager().allocate(valueRange.getType());

	// Update value range
	state.getVariableManager().setValue(variable, valueRange);

	// Random storage \todo [pyry] Check that scalar count in uniform/input classes is not exceeded
	static const Variable::Storage storages[] =
	{
		Variable::STORAGE_CONST,
		Variable::STORAGE_UNIFORM,
		Variable::STORAGE_LOCAL,
		Variable::STORAGE_SHADER_IN
	};
	float weights[DE_LENGTH_OF_ARRAY(storages)];

	// Dynamic vs. constant weight.
	float	dynWeight	= computeDynamicRangeWeight(valueRange);
	int		numScalars	= valueRange.getType().getScalarSize();
	bool	uniformOk	= state.getVariableManager().getNumAllocatedUniformScalars() + numScalars <= state.getShaderParameters().maxUniformScalars;
	bool	shaderInOk	= isShaderInOutSupportedType(valueRange.getType()) &&
						  (state.getVariableManager().getNumAllocatedShaderInVariables() + NUM_RESERVED_SHADER_INPUTS < state.getShaderParameters().maxInputVariables);

	weights[0] = de::max(1.0f-dynWeight, 0.1f);
	weights[1] = uniformOk ? dynWeight*0.5f : 0.0f;
	weights[2] = dynWeight;
	weights[3] = shaderInOk ? dynWeight*2.0f : 0.0f;

	state.getVariableManager().setStorage(variable, state.getRandom().chooseWeighted<Variable::Storage>(&storages[0], &storages[DE_LENGTH_OF_ARRAY(storages)], &weights[0]));

	return variable;
}